

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_SplitTxOutByAddress_Test::TestBody
          (TransactionContext_SplitTxOutByAddress_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<cfd::core::Amount> __l;
  initializer_list<cfd::core::Address> __l_00;
  allocator_type local_3d2;
  allocator local_3d1;
  AssertHelper local_3d0;
  string local_3c8;
  AssertionResult gtest_ar;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> el_list;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addresses;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> amounts;
  string tx_hex;
  ConfidentialTransactionContext tx;
  Address local_1a8;
  
  std::__cxx11::string::string
            ((string *)&tx_hex,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,(allocator *)&tx);
  cfd::core::Amount::Amount((Amount *)&tx,9000000);
  cfd::core::Amount::Amount((Amount *)&tx.super_ConfidentialTransaction.vin_,500000);
  __l._M_len = 2;
  __l._M_array = (iterator)&tx;
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            (&amounts,__l,(allocator_type *)&local_3c8);
  cfd::core::GetElementsAddressFormatList();
  std::__cxx11::string::string
            ((string *)&local_3c8,"ert1qz33wef9ehrvd7c64p27jf5xtvn50946xeekx50",
             (allocator *)&local_3d0);
  cfd::core::Address::Address((Address *)&tx,&local_3c8,&el_list);
  std::__cxx11::string::string((string *)&gtest_ar,"XWMioJVK77vhKHgnSpaCcSBDgf93LFHzYg",&local_3d1);
  cfd::core::Address::Address(&local_1a8,(string *)&gtest_ar,&el_list);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&tx;
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::vector
            (&addresses,__l_00,&local_3d2);
  lVar1 = 0x178;
  do {
    cfd::core::Address::~Address
              ((Address *)
               ((long)&tx.super_ConfidentialTransaction.super_AbstractTransaction.
                       _vptr_AbstractTransaction + lVar1));
    lVar1 = lVar1 + -0x178;
  } while (lVar1 != -0x178);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_3c8);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,&tx_hex);
  cfd::ConfidentialTransactionContext::SplitTxOut(&tx,0,&amounts,&addresses);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_3c8,(AbstractTransaction *)&tx);
  testing::internal::CmpHelperEQ<char[661],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0401f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000055d4a800374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000001f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001600141462eca4b9b8d8df63550abd24d0cb64e8f2d74601f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200017a914d081b8e259b744aa903e1831cfce8956941273ce8700000000\""
             ,"tx.GetHex()",
             (char (*) [661])
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0401f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000055d4a800374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000001f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001600141462eca4b9b8d8df63550abd24d0cb64e8f2d74601f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200017a914d081b8e259b744aa903e1831cfce8956941273ce8700000000"
             ,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x3b6,message);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&addresses);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&el_list);
  std::_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~_Vector_base
            (&amounts.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>);
  std::__cxx11::string::~string((string *)&tx_hex);
  return;
}

Assistant:

TEST(TransactionContext, SplitTxOutByAddress)
{
  std::string tx_hex = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  // 99500000
  std::vector<Amount> amounts = {
    Amount(int64_t{9000000}), Amount(int64_t{500000})};
  auto el_list = cfd::core::GetElementsAddressFormatList();
  std::vector<Address> addresses = {
    Address("ert1qz33wef9ehrvd7c64p27jf5xtvn50946xeekx50", el_list),
    Address("XWMioJVK77vhKHgnSpaCcSBDgf93LFHzYg", el_list)};

  ConfidentialTransactionContext tx(tx_hex);
  tx.SplitTxOut(0, amounts, addresses);
  EXPECT_EQ(
    "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0401f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000055d4a800374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000001f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001600141462eca4b9b8d8df63550abd24d0cb64e8f2d74601f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200017a914d081b8e259b744aa903e1831cfce8956941273ce8700000000",
    tx.GetHex());
}